

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

void nifti_mat44_to_quatern
               (mat44 R,float *qb,float *qc,float *qd,float *qx,float *qy,float *qz,float *dx,
               float *dy,float *dz,float *qfac)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  float fVar5;
  mat33 A;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  mat33 Q;
  undefined8 in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff30;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  
  if (qx != (float *)0x0) {
    *qx = R.m[0][3];
  }
  if (qy != (float *)0x0) {
    *qy = R.m[1][3];
  }
  if (qz != (float *)0x0) {
    *qz = R.m[2][3];
  }
  dVar6 = (double)R.m[2][0] * (double)R.m[2][0] +
          (double)R.m[0][0] * (double)R.m[0][0] + (double)R.m[1][0] * (double)R.m[1][0];
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar2 = (double)R.m[2][1] * (double)R.m[2][1] +
          (double)R.m[0][1] * (double)R.m[0][1] + (double)R.m[1][1] * (double)R.m[1][1];
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar3 = (double)R.m[2][2] * (double)R.m[2][2] +
          (double)R.m[0][2] * (double)R.m[0][2] + (double)R.m[1][2] * (double)R.m[1][2];
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  if ((dVar6 == 0.0) && (!NAN(dVar6))) {
    dVar6 = 1.0;
  }
  if ((dVar2 == 0.0) && (!NAN(dVar2))) {
    dVar2 = 1.0;
  }
  if ((dVar3 == 0.0) && (!NAN(dVar3))) {
    dVar3 = 1.0;
  }
  if (dx != (float *)0x0) {
    *dx = (float)dVar6;
  }
  if (dy != (float *)0x0) {
    *dy = (float)dVar2;
  }
  if (dz != (float *)0x0) {
    *dz = (float)dVar3;
  }
  A.m[0][2] = (float)(int)in_stack_ffffffffffffff18;
  A.m[1][0] = (float)(int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  A.m[0][0] = (float)(int)in_stack_ffffffffffffff10;
  A.m[0][1] = (float)(int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  A.m[1][1] = (float)(int)in_stack_ffffffffffffff20;
  A.m[1][2] = (float)(int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  A.m[2][0] = (float)(int)in_stack_ffffffffffffff28;
  A.m[2][1] = (float)(int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  A.m[2][2] = in_stack_ffffffffffffff30;
  nifti_mat33_polar(A);
  dVar8 = (double)local_4c;
  dVar9 = (double)local_48;
  dVar3 = (double)local_44;
  dVar10 = (double)local_40;
  dVar6 = (double)local_3c;
  dVar4 = (double)local_38;
  dVar11 = (double)local_34;
  dVar12 = (double)local_30;
  dVar2 = (double)local_2c;
  if ((dVar9 * dVar11 * dVar4 +
      dVar10 * dVar12 * dVar3 +
      ((dVar8 * dVar6 * dVar2 - dVar8 * dVar12 * dVar4) - dVar9 * dVar10 * dVar2)) -
      dVar6 * dVar11 * dVar3 <= 0.0) {
    if (qfac != (float *)0x0) {
      *qfac = -1.0;
    }
    dVar3 = -dVar3;
    dVar4 = -dVar4;
    dVar2 = -dVar2;
  }
  else if (qfac != (float *)0x0) {
    *qfac = 1.0;
  }
  dVar7 = dVar8 + dVar6 + dVar2 + 1.0;
  if (dVar7 <= 0.5) {
    dVar7 = (dVar8 + 1.0) - (dVar2 + dVar6);
    if (dVar7 <= 1.0) {
      dVar1 = (dVar6 + 1.0) - (dVar8 + dVar2);
      dVar12 = (dVar4 + dVar12) * 0.25;
      if (dVar1 <= 1.0) {
        dVar6 = (dVar2 + 1.0) - (dVar8 + dVar6);
        if (dVar6 < 0.0) {
          dVar6 = sqrt(dVar6);
        }
        else {
          dVar6 = SQRT(dVar6);
        }
        dVar6 = dVar6 * 0.5;
        dVar7 = ((dVar3 + dVar11) * 0.25) / dVar6;
        dVar1 = dVar12 / dVar6;
        dVar12 = dVar10 - dVar9;
        dVar2 = dVar6;
      }
      else {
        if (dVar1 < 0.0) {
          dVar1 = sqrt(dVar1);
        }
        else {
          dVar1 = SQRT(dVar1);
        }
        dVar1 = dVar1 * 0.5;
        dVar7 = ((dVar9 + dVar10) * 0.25) / dVar1;
        dVar6 = dVar12 / dVar1;
        dVar12 = dVar3 - dVar11;
        dVar2 = dVar1;
      }
    }
    else {
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      dVar7 = dVar7 * 0.5;
      dVar1 = ((dVar9 + dVar10) * 0.25) / dVar7;
      dVar6 = ((dVar3 + dVar11) * 0.25) / dVar7;
      dVar12 = dVar12 - dVar4;
      dVar2 = dVar7;
    }
    if ((dVar12 * 0.25) / dVar2 < 0.0) {
      dVar7 = -dVar7;
      dVar1 = -dVar1;
      dVar6 = -dVar6;
    }
  }
  else {
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    fVar5 = (float)(dVar7 * 0.5);
    dVar7 = (double)(((float)(dVar12 - dVar4) * 0.25) / fVar5);
    dVar1 = (double)(((float)(dVar3 - dVar11) * 0.25) / fVar5);
    dVar6 = (double)(((float)(dVar10 - dVar9) * 0.25) / fVar5);
  }
  if (qb != (float *)0x0) {
    *qb = (float)dVar7;
  }
  if (qc != (float *)0x0) {
    *qc = (float)dVar1;
  }
  if (qd != (float *)0x0) {
    *qd = (float)dVar6;
  }
  return;
}

Assistant:

void nifti_mat44_to_quatern( mat44 R ,
                             float *qb, float *qc, float *qd,
                             float *qx, float *qy, float *qz,
                             float *dx, float *dy, float *dz, float *qfac )
{
   double r11,r12,r13 , r21,r22,r23 , r31,r32,r33 ;
   double xd,yd,zd , a,b,c,d ;
   mat33 P,Q ;

   /* offset outputs are read write out of input matrix  */

   ASSIF(qx,R.m[0][3]) ; ASSIF(qy,R.m[1][3]) ; ASSIF(qz,R.m[2][3]) ;

   /* load 3x3 matrix into local variables */

   r11 = R.m[0][0] ; r12 = R.m[0][1] ; r13 = R.m[0][2] ;
   r21 = R.m[1][0] ; r22 = R.m[1][1] ; r23 = R.m[1][2] ;
   r31 = R.m[2][0] ; r32 = R.m[2][1] ; r33 = R.m[2][2] ;

   /* compute lengths of each column; these determine grid spacings  */

   xd = sqrt( r11*r11 + r21*r21 + r31*r31 ) ;
   yd = sqrt( r12*r12 + r22*r22 + r32*r32 ) ;
   zd = sqrt( r13*r13 + r23*r23 + r33*r33 ) ;

   /* if a column length is zero, patch the trouble */

   if( xd == 0.0l ){ r11 = 1.0l ; r21 = r31 = 0.0l ; xd = 1.0l ; }
   if( yd == 0.0l ){ r22 = 1.0l ; r12 = r32 = 0.0l ; yd = 1.0l ; }
   if( zd == 0.0l ){ r33 = 1.0l ; r13 = r23 = 0.0l ; zd = 1.0l ; }

   /* assign the output lengths */

   ASSIF(dx,(float)xd) ; ASSIF(dy,(float)yd) ; ASSIF(dz,(float)zd) ;

   /* normalize the columns */

   r11 /= xd ; r21 /= xd ; r31 /= xd ;
   r12 /= yd ; r22 /= yd ; r32 /= yd ;
   r13 /= zd ; r23 /= zd ; r33 /= zd ;

   /* At this point, the matrix has normal columns, but we have to allow
      for the fact that the hideous user may not have given us a matrix
      with orthogonal columns.

      So, now find the orthogonal matrix closest to the current matrix.

      One reason for using the polar decomposition to get this
      orthogonal matrix, rather than just directly orthogonalizing
      the columns, is so that inputting the inverse matrix to R
      will result in the inverse orthogonal matrix at this point.
      If we just orthogonalized the columns, this wouldn't necessarily hold. */

   Q.m[0][0] = (float)r11 ; Q.m[0][1] = (float)r12 ; Q.m[0][2] = (float)r13 ; /* load Q */
   Q.m[1][0] = (float)r21 ; Q.m[1][1] = (float)r22 ; Q.m[1][2] = (float)r23 ;
   Q.m[2][0] = (float)r31 ; Q.m[2][1] = (float)r32 ; Q.m[2][2] = (float)r33 ;

   P = nifti_mat33_polar(Q) ;  /* P is orthog matrix closest to Q */

   r11 = P.m[0][0] ; r12 = P.m[0][1] ; r13 = P.m[0][2] ; /* unload */
   r21 = P.m[1][0] ; r22 = P.m[1][1] ; r23 = P.m[1][2] ;
   r31 = P.m[2][0] ; r32 = P.m[2][1] ; r33 = P.m[2][2] ;

   /*                            [ r11 r12 r13 ]               */
   /* at this point, the matrix  [ r21 r22 r23 ] is orthogonal */
   /*                            [ r31 r32 r33 ]               */

   /* compute the determinant to determine if it is proper */

   zd = r11*r22*r33-r11*r32*r23-r21*r12*r33
       +r21*r32*r13+r31*r12*r23-r31*r22*r13 ;  /* should be -1 or 1 */

   if( zd > 0 ){             /* proper */
     ASSIF(qfac,1.0f) ;
   } else {                  /* improper ==> flip 3rd column */
     ASSIF(qfac,-1.0f) ;
     r13 = -r13 ; r23 = -r23 ; r33 = -r33 ;
   }

   /* now, compute quaternion parameters */

   a = r11 + r22 + r33 + 1.0l ;

   if( a > 0.5l ){                /* simplest case */
     a = 0.5l * sqrt(a) ;
     b = 0.25l * (r32-r23) / a ;
     c = 0.25l * (r13-r31) / a ;
     d = 0.25l * (r21-r12) / a ;
   } else {                       /* trickier case */
     xd = 1.0 + r11 - (r22+r33) ;  /* 4*b*b */
     yd = 1.0 + r22 - (r11+r33) ;  /* 4*c*c */
     zd = 1.0 + r33 - (r11+r22) ;  /* 4*d*d */
     if( xd > 1.0 ){
       b = 0.5l * sqrt(xd) ;
       c = 0.25l* (r12+r21) / b ;
       d = 0.25l* (r13+r31) / b ;
       a = 0.25l* (r32-r23) / b ;
     } else if( yd > 1.0 ){
       c = 0.5l * sqrt(yd) ;
       b = 0.25l* (r12+r21) / c ;
       d = 0.25l* (r23+r32) / c ;
       a = 0.25l* (r13-r31) / c ;
     } else {
       d = 0.5l * sqrt(zd) ;
       b = 0.25l* (r13+r31) / d ;
       c = 0.25l* (r23+r32) / d ;
       a = 0.25l* (r21-r12) / d ;
     }
     if( a < 0.0l ){ b=-b ; c=-c ; d=-d; a=-a; }
   }

   ASSIF(qb,(float)b) ; ASSIF(qc,(float)c) ; ASSIF(qd,(float)d) ;
   return ;
}